

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O1

void __thiscall
duckdb::RowGroupCollection::CleanupAppend
          (RowGroupCollection *this,transaction_t lowest_transaction,idx_t start,idx_t count)

{
  RowGroupSegmentTree *pRVar1;
  RowGroup *this_00;
  RowVersionManager *this_01;
  ulong count_00;
  idx_t row_group_start;
  
  pRVar1 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(&this->row_groups);
  this_00 = SegmentTree<duckdb::RowGroup,_true>::GetSegment
                      (&pRVar1->super_SegmentTree<duckdb::RowGroup,_true>,start);
  do {
    row_group_start = start - (this_00->super_SegmentBase<duckdb::RowGroup>).start;
    count_00 = (this_00->super_SegmentBase<duckdb::RowGroup>).count.
               super___atomic_base<unsigned_long>._M_i - row_group_start;
    if (count <= count_00) {
      count_00 = count;
    }
    this_01 = RowGroup::GetOrCreateVersionInfo(this_00);
    RowVersionManager::CleanupAppend(this_01,lowest_transaction,row_group_start,count_00);
    count = count - count_00;
    if (count != 0) {
      pRVar1 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(&this->row_groups);
      this_00 = SegmentTree<duckdb::RowGroup,_true>::GetNextSegment
                          (&pRVar1->super_SegmentTree<duckdb::RowGroup,_true>,this_00);
    }
    start = start + count_00;
  } while (count != 0);
  return;
}

Assistant:

void RowGroupCollection::CleanupAppend(transaction_t lowest_transaction, idx_t start, idx_t count) {
	auto row_group = row_groups->GetSegment(start);
	D_ASSERT(row_group);
	idx_t current_row = start;
	idx_t remaining = count;
	while (true) {
		idx_t start_in_row_group = current_row - row_group->start;
		idx_t append_count = MinValue<idx_t>(row_group->count - start_in_row_group, remaining);

		row_group->CleanupAppend(lowest_transaction, start_in_row_group, append_count);

		current_row += append_count;
		remaining -= append_count;
		if (remaining == 0) {
			break;
		}
		row_group = row_groups->GetNextSegment(row_group);
	}
}